

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Gridded_Data_PDU::SetGridData
          (Gridded_Data_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
          *GD)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pKVar4;
  GridData *pGVar5;
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
  local_58;
  KRef_Ptr<KDIS::DATA_TYPE::GridData> *local_50;
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
  local_48;
  KRef_Ptr<KDIS::DATA_TYPE::GridData> *local_40;
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
  local_38;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  *GD_local;
  Gridded_Data_PDU *this_local;
  
  citr._M_current = (KRef_Ptr<KDIS::DATA_TYPE::GridData> *)GD;
  citrEnd._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridData> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
       ::begin(&this->m_vGridData);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>>
              *)&local_20,
             (__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
              *)&citrEnd);
  local_38._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridData> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
       ::end(&this->m_vGridData);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pKVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
             ::operator*(&local_20);
    pGVar5 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::operator->(pKVar4);
    iVar2 = (*(pGVar5->super_DataTypeBase)._vptr_DataTypeBase[6])();
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength - (short)iVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
    ::operator++(&local_20);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ::operator=(&this->m_vGridData,
              (vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
               *)citr._M_current);
  sVar3 = std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
          ::size(&this->m_vGridData);
  this->m_ui8VecDim = (KUINT8)sVar3;
  local_48._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridData> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
       ::begin(&this->m_vGridData);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>>
              *)&local_40,&local_48);
  local_20._M_current = local_40;
  local_58._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::GridData> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
       ::end(&this->m_vGridData);
  __gnu_cxx::
  __normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>>
  ::__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>*>
            ((__normal_iterator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>const*,std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>>>>
              *)&local_50,&local_58);
  local_30._M_current = local_50;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    pKVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
             ::operator*(&local_20);
    pGVar5 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>::operator->(pKVar4);
    iVar2 = (*(pGVar5->super_DataTypeBase)._vptr_DataTypeBase[6])();
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + (short)iVar2;
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Gridded_Data_PDU::SetGridData( const std::vector<GridDataPtr> & GD )
{
    // Remove the old grid data from the PDU length.
    std::vector<GridDataPtr>::const_iterator citr = m_vGridData.begin();
    std::vector<GridDataPtr>::const_iterator citrEnd = m_vGridData.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= ( *citr )->GetSize();
    }

    m_vGridData = GD;
    m_ui8VecDim = m_vGridData.size();

    // Now recalculate the PDU length.
    citr = m_vGridData.begin();
    citrEnd = m_vGridData.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += ( *citr )->GetSize();
    }
}